

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O1

void Gia_QbfAddSpecialConstr(Qbf_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int Lits [2];
  int local_30;
  lit local_2c;
  
  iVar3 = 1;
  uVar4 = 0;
  do {
    if ((uVar4 & 3) == 0) {
      if ((long)p->vParMap->nSize <= (long)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar1 = p->vParMap->pArray;
      if (piVar1[uVar4] != -1) {
        __assert_fail("Vec_IntEntry(p->vParMap, i) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                      ,0x313,"void Gia_QbfAddSpecialConstr(Qbf_Man_t *)");
      }
      piVar1[uVar4] = 0;
      local_30 = iVar3;
      iVar2 = sat_solver_addclause(p->pSatSyn,&local_30,&local_2c);
      if (iVar2 == 0) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                      ,0x317,"void Gia_QbfAddSpecialConstr(Qbf_Man_t *)");
      }
    }
    uVar4 = uVar4 + 1;
    iVar3 = iVar3 + 2;
    if (uVar4 == 0x2c) {
      return;
    }
  } while( true );
}

Assistant:

void Gia_QbfAddSpecialConstr( Qbf_Man_t * p )
{
    int i, status, Lits[2];
    for ( i = 0; i < 4*11; i++ )
        if ( i % 4 == 0 )
        {
            assert( Vec_IntEntry(p->vParMap, i) == -1 );
            Vec_IntWriteEntry( p->vParMap, i, (i % 4) == 3 );
            Lits[0] = Abc_Var2Lit( i, (i % 4) != 3 );
            status = sat_solver_addclause( p->pSatSyn, Lits, Lits+1 );
            assert( status );
        }
}